

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::FormattedNumber::toString
          (UnicodeString *__return_storage_ptr__,FormattedNumber *this,UErrorCode *status)

{
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fResults != (UFormattedNumberData *)0x0) {
      impl::NumberStringBuilder::toUnicodeString(__return_storage_ptr__,&this->fResults->string);
      return __return_storage_ptr__;
    }
    *status = this->fErrorCode;
  }
  ICU_Utility::makeBogusString();
  return __return_storage_ptr__;
}

Assistant:

UnicodeString FormattedNumber::toString(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return ICU_Utility::makeBogusString();
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return ICU_Utility::makeBogusString();
    }
    return fResults->string.toUnicodeString();
}